

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

transformations_t *
opengv::absolute_pose::gp3p
          (transformations_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,
          vector<int,_std::allocator<int>_> *indices)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  transformations_t *solutions;
  rotation_t R;
  Matrix3d f;
  Matrix3d p;
  Matrix3d v;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  double local_158;
  double dStack_150;
  double local_148;
  undefined1 local_140 [16];
  double local_130;
  undefined1 local_128 [16];
  double local_118 [2];
  Matrix3d local_108;
  Matrix3d local_c0;
  Matrix3d local_78;
  
  lVar5 = 0x10;
  lVar4 = 0;
  do {
    (*adapter->_vptr_AbsoluteAdapterBase[2])
              (&local_158,adapter,
               (long)*(int *)((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_start + lVar4));
    *(double *)((long)local_118 + lVar5) = local_158;
    *(double *)((long)local_118 + lVar5 + 8) = dStack_150;
    *(double *)
     ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5) = local_148;
    (*adapter->_vptr_AbsoluteAdapterBase[5])
              (&local_158,adapter,
               (long)*(int *)((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_start + lVar4));
    dVar1 = *(double *)((long)local_118 + lVar5);
    auVar6._0_8_ = dVar1 * local_158;
    auVar6._8_8_ = dVar1 * dStack_150;
    dVar2 = *(double *)((long)local_118 + lVar5 + 8);
    auVar7._8_8_ = dVar2;
    auVar7._0_8_ = dVar2;
    auVar6 = vfmadd231pd_fma(auVar6,auVar7,local_140);
    dVar3 = *(double *)
             ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array + lVar5);
    auVar8._8_8_ = dVar3;
    auVar8._0_8_ = dVar3;
    auVar6 = vfmadd231pd_fma(auVar6,auVar8,local_128);
    *(undefined1 (*) [16])((long)local_118 + lVar5) = auVar6;
    *(double *)
     ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5) = dVar1 * local_148 + dVar2 * local_130 + dVar3 * local_118[0];
    (*adapter->_vptr_AbsoluteAdapterBase[4])
              (&local_178,adapter,
               (long)*(int *)((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_start + lVar4));
    *(undefined8 *)
     ((long)local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5 + 0x38) = local_178;
    *(undefined8 *)
     ((long)local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5 + 0x40) = uStack_170;
    *(undefined8 *)
     ((long)local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5) = local_168;
    (*adapter->_vptr_AbsoluteAdapterBase[6])
              (&local_178,adapter,
               (long)*(int *)((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_start + lVar4));
    *(undefined8 *)
     ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5 + 0x38) = local_178;
    *(undefined8 *)
     ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5 + 0x40) = uStack_170;
    *(undefined8 *)
     ((long)local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5) = local_168;
    lVar4 = lVar4 + 4;
    lVar5 = lVar5 + 0x18;
  } while (lVar4 != 0xc);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  modules::gp3p_main(&local_108,&local_78,&local_c0,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

opengv::transformations_t
opengv::absolute_pose::gp3p(
    const AbsoluteAdapterBase & adapter,
    const std::vector<int> & indices )
{
  assert(indices.size()>2);

  Eigen::Matrix3d f;
  Eigen::Matrix3d v;
  Eigen::Matrix3d p;

  for(size_t i = 0; i < 3; i++)
  {
    f.col(i) = adapter.getBearingVector(indices[i]);
    rotation_t R = adapter.getCamRotation(indices[i]);
    
    //unrotate the bearingVectors already so the camera rotation doesn't appear
    //in the problem
    f.col(i) = R * f.col(i);
    v.col(i) = adapter.getCamOffset(indices[i]);
    p.col(i) = adapter.getPoint(indices[i]);
  }

  transformations_t solutions;
  modules::gp3p_main(f,v,p,solutions);

  return solutions;
}